

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O3

int uv_pipe_open(uv_pipe_t *handle,uv_os_fd_t fd)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  
  iVar1 = uv__fd_exists(handle->loop,fd);
  iVar3 = -0x11;
  if (iVar1 == 0) {
    do {
      uVar2 = fcntl64(fd,3);
      if (uVar2 != 0xffffffff) {
        iVar1 = uv__nonblock_ioctl(fd,1);
        if (iVar1 != 0) {
          return iVar1;
        }
        iVar1 = 0x4000;
        if ((uVar2 & 3) != 0) {
          iVar1 = ((uVar2 & 3) != 1 | 2) << 0xe;
        }
        iVar1 = uv__stream_open((uv_stream_t *)handle,fd,iVar1);
        return iVar1;
      }
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    iVar3 = -*piVar4;
  }
  return iVar3;
}

Assistant:

int uv_pipe_open(uv_pipe_t* handle, uv_os_fd_t fd) {
  int flags;
  int mode;
  int err;
  flags = 0;

  if (uv__fd_exists(handle->loop, fd))
    return UV_EEXIST;

  do
    mode = fcntl(fd, F_GETFL);
  while (mode == -1 && errno == EINTR);

  if (mode == -1)
    return UV__ERR(errno); /* according to docs, must be EBADF */

  err = uv__nonblock(fd, 1);
  if (err)
    return err;

#if defined(__APPLE__)
  err = uv__stream_try_select((uv_stream_t*) handle, &fd);
  if (err)
    return err;
#endif /* defined(__APPLE__) */

  mode &= O_ACCMODE;
  if (mode != O_WRONLY)
    flags |= UV_HANDLE_READABLE;
  if (mode != O_RDONLY)
    flags |= UV_HANDLE_WRITABLE;

  return uv__stream_open((uv_stream_t*)handle, fd, flags);
}